

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

bool __thiscall
google::protobuf::MethodOptions::MergePartialFromCodedStream
          (MethodOptions *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  UnknownFieldSet *pUVar7;
  UninterpretedOption *value_00;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  int value;
  bool *local_40;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *local_38;
  
  local_38 = &this->uninterpreted_option_;
  local_40 = &this->deprecated_;
LAB_0030305b:
  pbVar3 = input->buffer_;
  uVar6 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    pbVar1 = pbVar3 + 1;
    uVar9 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar6 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar6 = (uint)bVar2, (~(uint)*pbVar1 & uVar9) < 0x80))
      goto LAB_003031b5;
      uVar9 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar10 = (ulong)uVar9 | 0x100000000;
  }
  else {
LAB_003031b5:
    uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
    uVar10 = 0;
    if (uVar6 - 1 < 0x3fff) {
      uVar10 = 0x100000000;
    }
    uVar10 = uVar6 | uVar10;
  }
  uVar9 = (uint)uVar10;
  if ((uVar10 & 0x100000000) != 0) {
    uVar5 = (uint)(uVar10 >> 3) & 0x1fffffff;
    cVar8 = (char)uVar10;
    if (uVar5 == 999) {
      if (cVar8 != ':') goto LAB_003030bc;
      value_00 = RepeatedPtrField<google::protobuf::UninterpretedOption>::Add(local_38);
      bVar4 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::UninterpretedOption>
                        (input,value_00);
      goto LAB_0030313c;
    }
    if (uVar5 == 0x22) {
      if (cVar8 != '\x10') goto LAB_003030bc;
      bVar4 = internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (input,&value);
      if (!bVar4) {
        return false;
      }
      if ((uint)value < 3) {
        set_idempotency_level(this,value);
      }
      else {
        pUVar7 = mutable_unknown_fields(this);
        UnknownFieldSet::AddVarint(pUVar7,0x22,(long)value);
      }
      goto LAB_0030305b;
    }
    if ((uVar5 == 0x21) && (cVar8 == '\b')) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      bVar4 = internal::WireFormatLite::
              ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                        (input,local_40);
      goto LAB_0030313c;
    }
  }
LAB_003030bc:
  if (uVar9 == 0) {
    return true;
  }
  if ((uVar9 & 7) == 4) {
    return true;
  }
  pUVar7 = mutable_unknown_fields(this);
  if (uVar9 < 8000) {
    bVar4 = internal::WireFormat::SkipField(input,uVar9,pUVar7);
  }
  else {
    bVar4 = internal::ExtensionSet::ParseField
                      (&this->_extensions_,uVar9,input,(Message *)&_MethodOptions_default_instance_,
                       pUVar7);
  }
LAB_0030313c:
  if (bVar4 == false) {
    return false;
  }
  goto LAB_0030305b;
}

Assistant:

bool MethodOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.MethodOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional bool deprecated = 33 [default = false];
      case 33: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(264u)) {
          set_has_deprecated();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .google.protobuf.MethodOptions.IdempotencyLevel idempotency_level = 34 [default = IDEMPOTENCY_UNKNOWN];
      case 34: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(272u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::MethodOptions_IdempotencyLevel_IsValid(value)) {
            set_idempotency_level(static_cast< ::google::protobuf::MethodOptions_IdempotencyLevel >(value));
          } else {
            mutable_unknown_fields()->AddVarint(34, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.MethodOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.MethodOptions)
  return false;
#undef DO_
}